

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::
     log<char_const(&)[84],kj::_::DebugComparison<kj::StringPtr,char_const(&)[35]>&,kj::StringPtr>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [84],
               DebugComparison<kj::StringPtr,_const_char_(&)[35]> *params_1,StringPtr *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  StringPtr *params_00;
  long lVar3;
  ArrayPtr<kj::String> in_stack_ffffffffffffff68;
  undefined8 auStack_88 [4];
  String local_68;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  str<char_const(&)[84]>
            ((String *)&stack0xffffffffffffff68,(kj *)params,
             (char (*) [84])CONCAT44(in_register_00000014,severity));
  _::operator*(&local_48,params_1);
  auStack_88[1] = local_48;
  auStack_88[2] = local_40;
  auStack_88[3] = uStack_38;
  str<kj::StringPtr&>(&local_68,(kj *)params_2,params_00);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff68,in_stack_ffffffffffffff68);
  lVar3 = 0x30;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff68 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff70 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff68 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff70 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)auStack_88 + lVar3))
                (*(undefined8 **)((long)auStack_88 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}